

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP5Reader::DoGetStructSync
          (BP5Reader *this,VariableStruct *variable,void *data)

{
  bool bVar1;
  int iVar2;
  ScopedTimer __var21692;
  ScopedTimer local_20;
  
  if (DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692 == '\0') {
    iVar2 = __cxa_guard_acquire(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692);
    if (iVar2 != 0) {
      DoGetStructSync::__var1692 = (void *)ps_timer_create_("BP5Reader::Get");
      __cxa_guard_release(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692);
    }
  }
  local_20.m_timer = DoGetStructSync::__var1692;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  bVar1 = adios2::format::BP5Deserializer::QueueGet
                    (this->m_BP5Deserializer,&variable->super_VariableBase,data,this->m_dataIsRemote
                    );
  if (bVar1) {
    PerformGets(this);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_20);
  return;
}

Assistant:

void BP5Reader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Get");
    GetSyncCommon(variable, data);
}